

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O2

TA_RetCode
TA_CDLUNIQUE3RIVER_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_ParamHolderInput *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = params->in;
  TVar2 = TA_CDLUNIQUE3RIVER(startIdx,endIdx,(pTVar1->data).inReal,(pTVar1->data).inPrice.high,
                             (pTVar1->data).inPrice.low,(pTVar1->data).inPrice.close,outBegIdx,
                             outNBElement,(params->out->data).outInteger);
  return TVar2;
}

Assistant:

TA_RetCode TA_CDLUNIQUE3RIVER_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLUNIQUE3RIVER(
/* Generated */                         startIdx,
/* Generated */                         endIdx,
/* Generated */                         params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                         params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                         params->in[0].data.inPrice.low, /* inLow */
/* Generated */                         params->in[0].data.inPrice.close, /* inClose */
/* Generated */                         outBegIdx, 
/* Generated */                         outNBElement, 
/* Generated */                         params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }